

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dynbuf *s;
  DNStype DVar1;
  int iVar2;
  dohdata *pdVar3;
  sockaddr *psVar4;
  undefined8 uVar5;
  ushort rdlength;
  DOHcode DVar6;
  uint uVar7;
  uchar *puVar8;
  size_t sVar9;
  size_t sVar10;
  Curl_addrinfo *pCVar11;
  Curl_dns_entry *pCVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  anon_union_16_2_f9ece763_for_ip *paVar18;
  CURLcode CVar19;
  int iVar20;
  ulong uVar21;
  ushort uVar22;
  ushort uVar23;
  long lVar24;
  dohentry *pdVar25;
  bool bVar26;
  DOHcode rc [2];
  dohentry de;
  Curl_addrinfo *local_388;
  Curl_addrinfo *local_358;
  undefined8 local_340;
  undefined8 local_338;
  Curl_dns_entry **local_330;
  uint local_328 [2];
  char local_31e [126];
  dohentry local_2a0;
  
  pdVar3 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar3 == (dohdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((pdVar3->probe[0].easy == (CURL_conflict *)0x0) &&
     (pdVar3->probe[1].easy == (CURL_conflict *)0x0)) {
    Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
    return (((data->conn->bits).field_0x4 & 0x20) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  if (pdVar3->pending != 0) {
    return CURLE_OK;
  }
  local_340 = 0;
  lVar17 = 8;
  local_330 = dnsp;
  do {
    curl_multi_remove_handle
              (data->multi,*(Curl_easy **)(pdVar3->probe[0].dohbuffer + lVar17 + -0x14));
    Curl_close((Curl_easy **)(pdVar3->probe[0].dohbuffer + lVar17 + -0x14));
    lVar17 = lVar17 + 0x238;
  } while (lVar17 == 0x240);
  lVar17 = 0;
  memset(&local_2a0,0,0x270);
  local_2a0.ttl = 0x7fffffff;
  do {
    Curl_dyn_init((dynbuf *)((long)&local_2a0.cname[0].bufr + lVar17),0x100);
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0x80);
  lVar17 = 0;
LAB_005df32e:
  if (pdVar3->probe[lVar17].dnstype != 0) {
    s = &pdVar3->probe[lVar17].serverdoh;
    puVar8 = Curl_dyn_uptr(s);
    sVar9 = Curl_dyn_len(s);
    DVar1 = pdVar3->probe[lVar17].dnstype;
    local_328[0] = 0xc;
    uVar21 = 4;
    if ((((0xb < sVar9) && (uVar21 = 0xc, puVar8 != (uchar *)0x0)) && (*puVar8 == '\0')) &&
       ((puVar8[1] == '\0' && (uVar21 = 8, (puVar8[3] & 0xf) == 0)))) {
      for (uVar22 = *(ushort *)(puVar8 + 4) << 8 | *(ushort *)(puVar8 + 4) >> 8; uVar22 != 0;
          uVar22 = uVar22 - 1) {
        DVar6 = skipqname(puVar8,sVar9,local_328);
        if (DVar6 != DOH_OK) goto LAB_005df6f1;
        if (sVar9 < local_328[0] + 4) {
          uVar21 = 2;
          goto LAB_005df3a6;
        }
        local_328[0] = local_328[0] + 4;
      }
      uVar23 = *(ushort *)(puVar8 + 6) << 8 | *(ushort *)(puVar8 + 6) >> 8;
      uVar22 = 0;
      do {
        if (uVar23 == 0) {
          uVar23 = *(ushort *)(puVar8 + 8) << 8 | *(ushort *)(puVar8 + 8) >> 8;
          goto joined_r0x005df5cf;
        }
        DVar6 = skipqname(puVar8,sVar9,local_328);
        if (DVar6 == DOH_OK) {
          uVar7 = local_328[0] + 2;
          uVar21 = 2;
          uVar15 = local_328[0];
          if (sVar9 < uVar7) goto LAB_005df5a9;
          uVar22 = *(ushort *)(puVar8 + (int)local_328[0]) << 8 |
                   *(ushort *)(puVar8 + (int)local_328[0]) >> 8;
          if (((uVar22 != 5) && (uVar22 != DNS_TYPE_DNAME)) && (DVar1 != uVar22)) {
            uVar21 = 9;
            goto LAB_005df5a9;
          }
          uVar14 = local_328[0] + 4;
          uVar15 = uVar7;
          if (sVar9 < uVar14) goto LAB_005df5a9;
          if ((ushort)(*(ushort *)(puVar8 + (int)uVar7) << 8 | *(ushort *)(puVar8 + (int)uVar7) >> 8
                      ) != 1) {
            uVar21 = 10;
            goto LAB_005df5a9;
          }
          uVar7 = local_328[0] + 8;
          uVar15 = uVar14;
          if (sVar9 < uVar7) goto LAB_005df5a9;
          uVar15 = *(uint *)(puVar8 + (int)uVar14);
          uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                   uVar15 << 0x18;
          if (uVar15 < local_2a0.ttl) {
            local_2a0.ttl = uVar15;
          }
          local_328[0] = local_328[0] + 10;
          uVar15 = uVar7;
          if (sVar9 < local_328[0]) goto LAB_005df5a9;
          rdlength = *(ushort *)(puVar8 + (int)uVar7) << 8 | *(ushort *)(puVar8 + (int)uVar7) >> 8;
          uVar7 = local_328[0] + rdlength;
          uVar15 = local_328[0];
          if (sVar9 < uVar7) goto LAB_005df5a9;
          DVar6 = rdata(puVar8,sVar9,rdlength,uVar22,local_328[0],&local_2a0);
          if (DVar6 != DOH_OK) goto LAB_005df4a8;
          uVar23 = uVar23 - 1;
          bVar26 = true;
          uVar21 = (ulong)local_358 & 0xffffffff;
          local_328[0] = uVar7;
        }
        else {
LAB_005df4a8:
          uVar21 = (ulong)DVar6;
          uVar15 = local_328[0];
LAB_005df5a9:
          local_328[0] = uVar15;
          bVar26 = false;
        }
        local_358 = (Curl_addrinfo *)uVar21;
      } while (bVar26);
    }
    goto LAB_005df3a6;
  }
  goto LAB_005df414;
joined_r0x005df5cf:
  if (uVar23 == 0) goto LAB_005df637;
  DVar6 = skipqname(puVar8,sVar9,local_328);
  if (DVar6 != DOH_OK) goto LAB_005df6f1;
  uVar15 = local_328[0] + 8;
  uVar21 = 2;
  if (((sVar9 < uVar15) || (uVar7 = local_328[0] + 10, local_328[0] = uVar15, sVar9 < uVar7)) ||
     (uVar15 = (ushort)(*(ushort *)(puVar8 + (int)uVar15) << 8 |
                       *(ushort *)(puVar8 + (int)uVar15) >> 8) + uVar7, local_328[0] = uVar7,
     sVar9 < uVar15)) goto LAB_005df3a6;
  uVar23 = uVar23 - 1;
  local_328[0] = uVar15;
  goto joined_r0x005df5cf;
LAB_005df637:
  for (uVar23 = *(ushort *)(puVar8 + 10) << 8 | *(ushort *)(puVar8 + 10) >> 8; uVar23 != 0;
      uVar23 = uVar23 - 1) {
    DVar6 = skipqname(puVar8,sVar9,local_328);
    if (DVar6 != DOH_OK) goto LAB_005df6f1;
    uVar15 = local_328[0] + 8;
    uVar21 = 2;
    if (((sVar9 < uVar15) || (uVar7 = local_328[0] + 10, local_328[0] = uVar15, sVar9 < uVar7)) ||
       (uVar15 = (ushort)(*(ushort *)(puVar8 + (int)uVar15) << 8 |
                         *(ushort *)(puVar8 + (int)uVar15) >> 8) + uVar7, local_328[0] = uVar7,
       sVar9 < uVar15)) goto LAB_005df3a6;
    local_328[0] = uVar15;
  }
  uVar21 = 7;
  if (sVar9 == local_328[0]) {
    uVar15 = 0;
    if (local_2a0.numaddr == 0 && local_2a0.numcname == 0) {
      uVar15 = 0xb;
    }
    if (uVar22 == 2) {
      uVar15 = 0;
    }
    uVar21 = (ulong)uVar15;
  }
LAB_005df3a6:
  uVar15 = (uint)uVar21;
  *(uint *)((long)&local_340 + lVar17 * 4) = uVar15;
  Curl_dyn_free(s);
  if (uVar15 != 0) {
    pcVar16 = "bad error code";
    if (uVar15 < 0xe) {
      pcVar16 = errors_rel + *(int *)(errors_rel + uVar21 * 4);
    }
    pcVar13 = "AAAA";
    if (pdVar3->probe[lVar17].dnstype == DNS_TYPE_A) {
      pcVar13 = "A";
    }
    Curl_infof(data,"DoH: %s type %s for %s",pcVar16,pcVar13,pdVar3->host);
  }
LAB_005df414:
  bVar26 = lVar17 != 0;
  lVar17 = lVar17 + 1;
  if (bVar26) goto LAB_005df704;
  goto LAB_005df32e;
LAB_005df6f1:
  uVar21 = (ulong)DVar6;
  goto LAB_005df3a6;
LAB_005df704:
  if ((int)local_340 != 0) {
    CVar19 = CURLE_COULDNT_RESOLVE_HOST;
    if (local_340._4_4_ != 0) goto LAB_005dfb58;
  }
  Curl_infof(data,"DoH Host name: %s",pdVar3->host);
  Curl_infof(data,"TTL: %u seconds",(ulong)local_2a0.ttl);
  if (0 < local_2a0.numaddr) {
    puVar8 = local_2a0.addr[0].ip.v4 + 1;
    lVar17 = 0;
    do {
      iVar2 = local_2a0.addr[lVar17].type;
      if (iVar2 == 0x1c) {
        curl_msnprintf((char *)local_328,0x80,"DoH AAAA: ");
        sVar9 = 0x76;
        uVar21 = 0xfffffffffffffffe;
        pcVar16 = local_31e;
        do {
          pcVar13 = "    :";
          if (uVar21 == 0xfffffffffffffffe) {
            pcVar13 = "PK\x01\x02";
          }
          curl_msnprintf(pcVar16,sVar9,"%s%02x%02x",pcVar13 + 4,(ulong)puVar8[uVar21 + 1],
                         (ulong)puVar8[uVar21 + 2]);
          sVar10 = strlen(pcVar16);
          sVar9 = sVar9 - sVar10;
          pcVar16 = pcVar16 + sVar10;
          uVar21 = uVar21 + 2;
        } while (uVar21 < 0xe);
        Curl_infof(data,"%s",local_328);
      }
      else if (iVar2 == 1) {
        Curl_infof(data,"DoH A: %u.%u.%u.%u",(ulong)local_2a0.addr[lVar17].ip.v4[0],
                   (ulong)local_2a0.addr[lVar17].ip.v4[1],(ulong)local_2a0.addr[lVar17].ip.v4[2],
                   (ulong)local_2a0.addr[lVar17].ip.v4[3]);
      }
      lVar17 = lVar17 + 1;
      puVar8 = puVar8 + 0x14;
    } while (lVar17 < local_2a0.numaddr);
  }
  if (0 < local_2a0.numcname) {
    pdVar25 = &local_2a0;
    lVar17 = 0;
    do {
      pcVar16 = Curl_dyn_ptr(pdVar25->cname);
      Curl_infof(data,"CNAME: %s",pcVar16);
      lVar17 = lVar17 + 1;
      pdVar25 = (dohentry *)(pdVar25->cname + 1);
    } while (lVar17 < local_2a0.numcname);
  }
  pcVar16 = pdVar3->host;
  sVar10 = strlen(pcVar16);
  if (local_2a0.numaddr < 1) {
    bVar26 = true;
    local_388 = (Curl_addrinfo *)0x0;
  }
  else {
    local_338 = 0;
    uVar22 = (ushort)pdVar3->port;
    paVar18 = &local_2a0.addr[0].ip;
    lVar17 = 0;
    local_358 = (Curl_addrinfo *)0x0;
    local_388 = (Curl_addrinfo *)0x0;
    do {
      iVar2 = ((dohaddr *)((long)paVar18 + -4))->type;
      lVar24 = 0x1c;
      if (iVar2 != 0x1c) {
        lVar24 = 0x10;
      }
      pCVar11 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar10 + 0x31 + lVar24);
      if (pCVar11 == (Curl_addrinfo *)0x0) {
        local_338 = 0x1b;
      }
      else {
        pCVar11->ai_addr = (sockaddr *)(pCVar11 + 1);
        pcVar13 = (char *)((long)&pCVar11[1].ai_flags + lVar24);
        pCVar11->ai_canonname = pcVar13;
        memcpy(pcVar13,pcVar16,sVar10 + 1);
        if (local_388 == (Curl_addrinfo *)0x0) {
          local_388 = pCVar11;
        }
        if (local_358 != (Curl_addrinfo *)0x0) {
          local_358->ai_next = pCVar11;
        }
        iVar20 = (uint)(iVar2 == 0x1c) * 8 + 2;
        pCVar11->ai_family = iVar20;
        pCVar11->ai_socktype = 1;
        pCVar11->ai_addrlen = (curl_socklen_t)lVar24;
        psVar4 = pCVar11->ai_addr;
        if (iVar2 == 0x1c) {
          uVar5 = *(undefined8 *)((long)paVar18 + 8);
          *(undefined8 *)(psVar4->sa_data + 6) = *(undefined8 *)paVar18;
          psVar4[1].sa_family = (short)uVar5;
          psVar4[1].sa_data[0] = (char)((ulong)uVar5 >> 0x10);
          psVar4[1].sa_data[1] = (char)((ulong)uVar5 >> 0x18);
          psVar4[1].sa_data[2] = (char)((ulong)uVar5 >> 0x20);
          psVar4[1].sa_data[3] = (char)((ulong)uVar5 >> 0x28);
          psVar4[1].sa_data[4] = (char)((ulong)uVar5 >> 0x30);
          psVar4[1].sa_data[5] = (char)((ulong)uVar5 >> 0x38);
        }
        else {
          *(undefined4 *)(psVar4->sa_data + 2) = *(undefined4 *)paVar18;
        }
        psVar4->sa_family = (sa_family_t)iVar20;
        *(ushort *)psVar4->sa_data = uVar22 << 8 | uVar22 >> 8;
        local_358 = pCVar11;
      }
      if (pCVar11 == (Curl_addrinfo *)0x0) break;
      lVar17 = lVar17 + 1;
      paVar18 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar18 + 0x14);
    } while (lVar17 < local_2a0.numaddr);
    bVar26 = (int)local_338 == 0;
  }
  pdVar25 = &local_2a0;
  if (!bVar26) {
    Curl_freeaddrinfo(local_388);
    local_388 = (Curl_addrinfo *)0x0;
  }
  if (local_388 == (Curl_addrinfo *)0x0) {
    CVar19 = CURLE_COULDNT_RESOLVE_HOST;
    if (0 < local_2a0.numcname) {
      lVar17 = 0;
      do {
        Curl_dyn_free(pdVar25->cname);
        lVar17 = lVar17 + 1;
        pdVar25 = (dohentry *)(pdVar25->cname + 1);
      } while (lVar17 < local_2a0.numcname);
    }
  }
  else {
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    pCVar12 = Curl_cache_addr(data,local_388,pdVar3->host,pdVar3->port);
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
    if (pCVar12 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo(local_388);
      CVar19 = CURLE_COULDNT_RESOLVE_HOST;
    }
    else {
      (data->state).async.dns = pCVar12;
      *local_330 = pCVar12;
      CVar19 = CURLE_OK;
    }
  }
  if (local_388 == (Curl_addrinfo *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
LAB_005dfb58:
  if (0 < local_2a0.numcname) {
    pdVar25 = &local_2a0;
    lVar17 = 0;
    do {
      Curl_dyn_free(pdVar25->cname);
      lVar17 = lVar17 + 1;
      pdVar25 = (dohentry *)(pdVar25->cname + 1);
    } while (lVar17 < local_2a0.numcname);
  }
  (*Curl_cfree)((data->req).doh);
  (data->req).doh = (dohdata *)0x0;
  return CVar19;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct dohdata *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(!dohp->probe[DOH_PROBE_SLOT_IPADDR_V4].easy &&
     !dohp->probe[DOH_PROBE_SLOT_IPADDR_V6].easy) {
    failf(data, "Could not DoH-resolve: %s", data->state.async.hostname);
    return CONN_IS_PROXIED(data->conn)?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_PROBE_SLOTS] = {
      DOH_OK, DOH_OK
    };
    struct dohentry de;
    int slot;
    /* remove DoH handles from multi handle and close them */
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
      Curl_close(&dohp->probe[slot].easy);
    }
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      struct dnsprobe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_decode(Curl_dyn_uptr(&p->serverdoh),
                            Curl_dyn_len(&p->serverdoh),
                            p->dnstype,
                            &de);
      Curl_dyn_free(&p->serverdoh);
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              type2name(p->dnstype), dohp->host);
      }
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_PROBE_SLOT_IPADDR_V4] || !rc[DOH_PROBE_SLOT_IPADDR_V6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DoH Host name: %s", dohp->host);
      showdoh(data, &de);

      ai = doh2ai(&de, dohp->host, dohp->port);
      if(!ai) {
        de_cleanup(&de);
        return CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, dohp->port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */

    /* All done */
    de_cleanup(&de);
    Curl_safefree(data->req.doh);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}